

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O2

bool dxil_spv::get_constant_quad_lane(Value *lane,uint32_t *quad_lane)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint in_EAX;
  BinaryOps BVar4;
  BinaryOperator *this;
  Value *value;
  Value *value_00;
  uint uStack_38;
  uint32_t secondary_quad_lane;
  
  uStack_38 = in_EAX;
  this = LLVMBC::dyn_cast<LLVMBC::BinaryOperator>(lane);
  if (this == (BinaryOperator *)0x0) {
    return false;
  }
  value = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
  value_00 = LLVMBC::Instruction::getOperand(&this->super_Instruction,1);
  bVar1 = value_is_wave_lane(value);
  bVar2 = value_is_wave_lane(value_00);
  _uStack_38 = (ulong)uStack_38;
  BVar4 = LLVMBC::BinaryOperator::getOpcode(this);
  if (BVar4 == Or) {
    bVar3 = get_constant_int(value,quad_lane);
    if ((bVar2 && bVar3) || ((bVar1 && (bVar1 = get_constant_int(value_00,quad_lane), bVar1)))) {
      return *quad_lane == 3;
    }
  }
  else {
    BVar4 = LLVMBC::BinaryOperator::getOpcode(this);
    if (BVar4 == And) {
      bVar3 = get_constant_int(value,quad_lane);
      if (!bVar2 || !bVar3) {
        if (!bVar1) {
          return false;
        }
        bVar1 = get_constant_int(value_00,quad_lane);
        if (!bVar1) {
          return false;
        }
      }
      if (*quad_lane != 0xfffffffc) {
        return false;
      }
      *quad_lane = 0;
      return true;
    }
    BVar4 = LLVMBC::BinaryOperator::getOpcode(this);
    if (BVar4 != Add) {
      return false;
    }
  }
  bVar1 = get_constant_int(value,quad_lane);
  if (((!bVar1) || (bVar1 = get_constant_quad_lane(value_00,&secondary_quad_lane), !bVar1)) &&
     ((bVar1 = get_constant_quad_lane(value,&secondary_quad_lane), !bVar1 ||
      (bVar1 = get_constant_int(value_00,quad_lane), !bVar1)))) {
    return false;
  }
  return secondary_quad_lane == 0 && *quad_lane < 4;
}

Assistant:

static bool get_constant_quad_lane(const llvm::Value *lane, uint32_t *quad_lane)
{
	// Cases to consider:
	// - (gl_SubgroupInvocationID & ~3u) | C, where C is [0, 1, 2, 3].
	// - (gl_SubgroupInvocationID & ~3u) + C, where C is [0, 1, 2, 3].
	// - (gl_SubgroupInvocationID & ~3u) -> C = 0
	// - (gl_SubgroupInvocationID | 3u) -> C = 3
	auto *binop = llvm::dyn_cast<llvm::BinaryOperator>(lane);
	if (!binop)
		return false;

	auto *lhs = binop->getOperand(0);
	auto *rhs = binop->getOperand(1);
	bool lhs_is_wave_lane = value_is_wave_lane(lhs);
	bool rhs_is_wave_lane = value_is_wave_lane(rhs);
	uint32_t secondary_quad_lane = 0;

	if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Or)
	{
		if ((get_constant_int(lhs, quad_lane) && rhs_is_wave_lane) ||
		    (lhs_is_wave_lane && get_constant_int(rhs, quad_lane)))
		{
			// Case 3
			return *quad_lane == 3;
		}
		else if ((get_constant_int(lhs, quad_lane) && get_constant_quad_lane(rhs, &secondary_quad_lane)) ||
		         (get_constant_quad_lane(lhs, &secondary_quad_lane) && get_constant_int(rhs, quad_lane)))
		{
			// Case 0
			return *quad_lane < 4 && secondary_quad_lane == 0;
		}
	}
	else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::And)
	{
		if ((get_constant_int(lhs, quad_lane) && rhs_is_wave_lane) ||
		    (lhs_is_wave_lane && get_constant_int(rhs, quad_lane)))
		{
			// Case 2
			if (*quad_lane == ~3u)
			{
				*quad_lane = 0;
				return true;
			}
		}
	}
	else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add)
	{
		if ((get_constant_int(lhs, quad_lane) && get_constant_quad_lane(rhs, &secondary_quad_lane)) ||
		    (get_constant_quad_lane(lhs, &secondary_quad_lane) && get_constant_int(rhs, quad_lane)))
		{
			// Case 0
			return *quad_lane < 4 && secondary_quad_lane == 0;
		}
	}

	return false;
}